

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::B44Compressor::B44Compressor
          (B44Compressor *this,Header *hdr,size_t maxScanLineSize,size_t numScanLines,
          bool optFlatFields)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Header *pHVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  unsigned_long uVar6;
  Channel *pCVar7;
  Box2i *pBVar8;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Header *in_RSI;
  Compressor *in_RDI;
  ulong uVar9;
  byte in_R8B;
  Box2i *dataWindow;
  ConstIterator c_1;
  int i;
  size_t padding;
  ConstIterator c;
  int numHalfChans;
  ChannelList *channels;
  ChannelList *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  PixelType in_stack_fffffffffffffec4;
  unsigned_long in_stack_fffffffffffffec8;
  unsigned_long in_stack_fffffffffffffed0;
  int local_64;
  int local_44;
  
  Compressor::Compressor(in_RDI,in_RSI);
  in_RDI->_vptr_Compressor = (_func_int **)&PTR__B44Compressor_00441378;
  *(undefined4 *)&in_RDI[1]._vptr_Compressor = in_EDX;
  *(byte *)((long)&in_RDI[1]._vptr_Compressor + 4) = in_R8B & 1;
  *(undefined4 *)&in_RDI[1]._header = 1;
  *(undefined4 *)((long)&in_RDI[1]._header + 4) = in_ECX;
  in_RDI[2]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[2]._header = (Header *)0x0;
  *(undefined4 *)&in_RDI[3]._vptr_Compressor = 0;
  pHVar3 = (Header *)Header::channels((Header *)0x15e6fe);
  in_RDI[3]._header = pHVar3;
  in_RDI[4]._vptr_Compressor = (_func_int **)0x0;
  uiMult<unsigned_long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  sVar4 = checkArraySize<unsigned_long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar9 = sVar4 * 2;
  if (CARRY8(sVar4,sVar4)) {
    uVar9 = 0xffffffffffffffff;
  }
  pp_Var5 = (_func_int **)operator_new__(uVar9);
  in_RDI[2]._vptr_Compressor = pp_Var5;
  Compressor::header(in_RDI);
  Header::channels((Header *)0x15e7bb);
  local_44 = 0;
  ChannelList::begin(in_stack_fffffffffffffeb8);
  while( true ) {
    ChannelList::end(in_stack_fffffffffffffeb8);
    bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (ConstIterator *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    *(int *)&in_RDI[3]._vptr_Compressor = *(int *)&in_RDI[3]._vptr_Compressor + 1;
    pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x15e86a);
    if (pCVar7->type == HALF) {
      local_44 = local_44 + 1;
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  uiMult<unsigned_long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar6 = uiAdd<unsigned_long>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pHVar3 = (Header *)operator_new__(uVar6);
  in_RDI[2]._header = pHVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)&in_RDI[3]._vptr_Compressor;
  uVar9 = SUB168(auVar1 * ZEXT816(0x28),0);
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pp_Var5 = (_func_int **)operator_new__(uVar9);
  in_RDI[4]._vptr_Compressor = pp_Var5;
  local_64 = 0;
  ChannelList::begin(in_stack_fffffffffffffeb8);
  while( true ) {
    ChannelList::end(in_stack_fffffffffffffeb8);
    bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                (ConstIterator *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x15ea07);
    *(int *)(in_RDI[4]._vptr_Compressor + (long)local_64 * 5 + 3) = pCVar7->ySampling;
    pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x15ea3f);
    *(PixelType *)((long)in_RDI[4]._vptr_Compressor + (long)local_64 * 0x28 + 0x1c) = pCVar7->type;
    pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x15ea76);
    *(byte *)(in_RDI[4]._vptr_Compressor + (long)local_64 * 5 + 4) = pCVar7->pLinear & 1;
    ChannelList::ConstIterator::channel((ConstIterator *)0x15eab1);
    in_stack_fffffffffffffec4 = pixelTypeSize(in_stack_fffffffffffffec4);
    in_stack_fffffffffffffec0 = pixelTypeSize(in_stack_fffffffffffffec4);
    *(int *)((long)in_RDI[4]._vptr_Compressor + (long)local_64 * 0x28 + 0x24) =
         (int)in_stack_fffffffffffffec4 / in_stack_fffffffffffffec0;
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_64 = local_64 + 1;
  }
  pBVar8 = Header::dataWindow((Header *)0x15eb37);
  *(int *)&in_RDI[4]._header = (pBVar8->min).x;
  *(int *)((long)&in_RDI[4]._header + 4) = (pBVar8->max).x;
  *(int *)&in_RDI[5]._vptr_Compressor = (pBVar8->max).y;
  if (*(int *)&in_RDI[3]._vptr_Compressor == local_44) {
    *(undefined4 *)&in_RDI[1]._header = 0;
  }
  return;
}

Assistant:

B44Compressor::B44Compressor
    (const Header &hdr,
     size_t maxScanLineSize,
     size_t numScanLines,
     bool optFlatFields)
:
    Compressor (hdr),
    _maxScanLineSize (maxScanLineSize),
    _optFlatFields (optFlatFields),
    _format (XDR),
    _numScanLines (numScanLines),
    _tmpBuffer (0),
    _outBuffer (0),
    _numChans (0),
    _channels (hdr.channels()),
    _channelData (0)
{
    // TODO: Remove this when we can change the ABI
    (void)_maxScanLineSize;
    //
    // Allocate buffers for compressed an uncompressed pixel data,
    // allocate a set of ChannelData structs to help speed up the
    // compress() and uncompress() functions, below, and determine
    // if uncompressed pixel data should be in native or Xdr format.
    //

    _tmpBuffer = new unsigned short
        [checkArraySize (uiMult (maxScanLineSize, numScanLines),
                         sizeof (unsigned short))];

    const ChannelList &channels = header().channels();
    int numHalfChans = 0;

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c)
    {
	assert (pixelTypeSize (c.channel().type) % pixelTypeSize (HALF) == 0);
	++_numChans;

	if (c.channel().type == HALF)
	    ++numHalfChans;
    }

    //
    // Compressed data may be larger than the input data
    //

    size_t padding = 12 * numHalfChans * (numScanLines + 3) / 4;

    _outBuffer = new char
        [uiAdd (uiMult (maxScanLineSize, numScanLines), padding)];

    _channelData = new ChannelData[_numChans];

    int i = 0;

    for (ChannelList::ConstIterator c = channels.begin();
	 c != channels.end();
	 ++c, ++i)
    {
	_channelData[i].ys = c.channel().ySampling;
	_channelData[i].type = c.channel().type;
	_channelData[i].pLinear = c.channel().pLinear;
	_channelData[i].size =
	    pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);
    }

    const Box2i &dataWindow = hdr.dataWindow();

    _minX = dataWindow.min.x;
    _maxX = dataWindow.max.x;
    _maxY = dataWindow.max.y;

    //
    // We can support uncompressed data in the machine's native
    // format only if all image channels are of type HALF.
    //

    assert (sizeof (unsigned short) == pixelTypeSize (HALF));

    if (_numChans == numHalfChans)
	_format = NATIVE;
}